

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

double cpplog::log(double __x)

{
  bool bVar1;
  Local *this;
  rep rVar2;
  Level in_DIL;
  double extraout_XMM0_Qa;
  double dVar3;
  
  this = (Local *)internal::local();
  bVar1 = internal::Local::willBeLogged(this,in_DIL);
  if (bVar1) {
    rVar2 = std::chrono::_V2::system_clock::now();
    (this->start).__d.__r = rVar2;
    this->level = in_DIL;
    dVar3 = extraout_XMM0_Qa;
  }
  else {
    dVar3 = (double)std::wios::setstate((int)*(undefined8 *)(*(long *)this + -0x18) + (int)this);
  }
  return dVar3;
}

Assistant:

std::wostream& cpplog::log(Level level)
{
    auto& local = cpplog::internal::local;
    if(!(local.willBeLogged(level)))
    {
        // apparently setting the bad-bit will prevent the << operators from running conversion, which saves some
        // processing power
        // https://stackoverflow.com/questions/8243743/is-there-a-null-stdostream-implementation-in-c-or-libraries
        local.stream.setstate(std::ios::badbit);
    }
    else
    {
        local.start = std::chrono::system_clock::now();
        local.level = level;
    }
    return local.stream;
}